

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<3UL> * physical_model::gyroscope(void)

{
  initializer_list<float> list;
  vector<3UL> *in_RDI;
  matrix<3UL,_1UL> local_78;
  matrix<3UL,_1UL> local_60;
  result_type_conflict1 local_44;
  result_type_conflict1 local_40;
  result_type_conflict1 local_3c;
  iterator local_38;
  undefined8 local_30;
  vector<3UL> local_28;
  
  local_44 = std::normal_distribution<float>::operator()
                       ((normal_distribution<float> *)gyr_noise_x,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)gen);
  local_40 = std::normal_distribution<float>::operator()
                       ((normal_distribution<float> *)gyr_noise_y,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)gen);
  local_3c = std::normal_distribution<float>::operator()
                       ((normal_distribution<float> *)gyr_noise_z,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)gen);
  local_38 = &local_44;
  local_30 = 3;
  list._M_len = 3;
  list._M_array = local_38;
  blas::vector<3UL>::vector(&local_28,list);
  blas::vector<3UL>::operator+=(&gyroscope::random_walk,&local_28);
  blas::matrix<3UL,_1UL>::operator+
            (&local_78,(matrix<3UL,_1UL> *)gyr_real,(matrix<3UL,_1UL> *)gyr_bias);
  blas::matrix<3UL,_1UL>::operator+
            (&local_60,&local_78,&gyroscope::random_walk.super_matrix<3UL,_1UL>);
  blas::vector<3UL>::vector(in_RDI,&local_60);
  return in_RDI;
}

Assistant:

const blas::vector<3> gyroscope() {
        static blas::vector<3> random_walk;
        random_walk += {gyr_noise_x(gen), gyr_noise_y(gen), gyr_noise_z(gen)};
        return gyr_real + gyr_bias + random_walk;
    }